

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O0

void __thiscall
TPZReducedSpace::ShapeX(TPZReducedSpace *this,TPZVec<double> *qsi,TPZMaterialDataT<double> *data)

{
  int64_t iVar1;
  TPZManVector<double,_10> *pTVar2;
  int64_t iVar3;
  int64_t iVar4;
  double *pdVar5;
  long in_RDX;
  TPZReducedSpace *in_RDI;
  int id;
  int istate;
  int64_t isol;
  int dim;
  int nstate;
  int64_t nsol;
  bool hasPhi;
  TPZMaterialDataT<double> inteldata;
  TPZInterpolationSpace *intel;
  undefined1 in_stack_ffffffffffff7d5f;
  TPZMaterialDataT<double> *in_stack_ffffffffffff7d60;
  double dVar6;
  TPZVec<double> *in_stack_ffffffffffff7d68;
  TPZInterpolationSpace *this_00;
  int in_stack_ffffffffffff7d78;
  int iVar7;
  TPZFMatrix<double> *this_01;
  TPZMaterialDataT<double> *in_stack_ffffffffffff7d90;
  int64_t in_stack_ffffffffffff7dc8;
  TPZIntPoints *in_stack_ffffffffffff7dd0;
  TPZFMatrix<double> *in_stack_ffffffffffff7dd8;
  TPZManVector<TPZManVector<double,_10>,_20> *in_stack_ffffffffffff7e18;
  TPZManVector<TPZManVector<double,_10>,_20> *in_stack_ffffffffffff7e20;
  TPZManVector<TPZFNMatrix<30,_double>,_20> *in_stack_ffffffffffff7f38;
  TPZManVector<TPZFNMatrix<30,_double>,_20> *in_stack_ffffffffffff7f40;
  
  ReferredIntel(in_RDI);
  this_00 = (TPZInterpolationSpace *)&stack0xffffffffffff7db0;
  TPZMaterialDataT<double>::TPZMaterialDataT(in_stack_ffffffffffff7d90);
  TPZInterpolationSpace::ComputeSolution
            (this_00,in_stack_ffffffffffff7d68,in_stack_ffffffffffff7d60,
             (bool)in_stack_ffffffffffff7d5f);
  TPZManVector<TPZManVector<double,_10>,_20>::operator=
            (in_stack_ffffffffffff7e20,in_stack_ffffffffffff7e18);
  TPZManVector<TPZFNMatrix<30,_double>,_20>::operator=
            (in_stack_ffffffffffff7f40,in_stack_ffffffffffff7f38);
  TPZMaterialDataT<double>::~TPZMaterialDataT(in_stack_ffffffffffff7d60);
  iVar1 = TPZVec<TPZManVector<double,_10>_>::size
                    ((TPZVec<TPZManVector<double,_10>_> *)(in_RDX + 0x48d0));
  pTVar2 = TPZVec<TPZManVector<double,_10>_>::operator[]
                     ((TPZVec<TPZManVector<double,_10>_> *)(in_RDX + 0x48d0),0);
  iVar3 = TPZVec<double>::size(&pTVar2->super_TPZVec<double>);
  iVar4 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDX + 0x3f20));
  TPZFMatrix<double>::Resize
            (in_stack_ffffffffffff7dd8,(int64_t)in_stack_ffffffffffff7dd0,in_stack_ffffffffffff7dc8)
  ;
  TPZFMatrix<double>::Resize
            (in_stack_ffffffffffff7dd8,(int64_t)in_stack_ffffffffffff7dd0,in_stack_ffffffffffff7dc8)
  ;
  for (this_01 = (TPZFMatrix<double> *)0x0; (long)this_01 < iVar1;
      this_01 = (TPZFMatrix<double> *)
                ((long)&(this_01->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                        _vptr_TPZSavable + 1)) {
    for (iVar7 = 0; iVar7 < (int)iVar3; iVar7 = iVar7 + 1) {
      pTVar2 = TPZVec<TPZManVector<double,_10>_>::operator[]
                         ((TPZVec<TPZManVector<double,_10>_> *)(in_RDX + 0x48d0),(int64_t)this_01);
      pdVar5 = TPZVec<double>::operator[](&pTVar2->super_TPZVec<double>,(long)iVar7);
      dVar6 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()
                         (this_01,CONCAT44(iVar7,in_stack_ffffffffffff7d78),(int64_t)this_00);
      *pdVar5 = dVar6;
      for (in_stack_ffffffffffff7d78 = 0; in_stack_ffffffffffff7d78 < (int)iVar4;
          in_stack_ffffffffffff7d78 = in_stack_ffffffffffff7d78 + 1) {
        TPZVec<TPZFNMatrix<30,_double>_>::operator[]
                  ((TPZVec<TPZFNMatrix<30,_double>_> *)(in_RDX + 0x51b0),(int64_t)this_01);
        pdVar5 = TPZFMatrix<double>::operator()
                           (this_01,CONCAT44(iVar7,in_stack_ffffffffffff7d78),(int64_t)this_00);
        dVar6 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (this_01,CONCAT44(iVar7,in_stack_ffffffffffff7d78),(int64_t)this_00);
        *pdVar5 = dVar6;
      }
    }
  }
  return;
}

Assistant:

void TPZReducedSpace::ShapeX(TPZVec<REAL> &qsi,TPZMaterialDataT<STATE> &data)
{
    TPZInterpolationSpace *intel = ReferredIntel();

    {
        TPZMaterialDataT<STATE> inteldata;
        inteldata.fNeedsSol=true;
        constexpr bool hasPhi{false};
        intel->ComputeSolution(qsi,inteldata,hasPhi);
        data.sol = std::move(inteldata.sol);
        data.dsol = std::move(inteldata.dsol);
    }
    int64_t nsol = data.sol.size();
    int nstate = data.sol[0].size();
    int dim = data.axes.Rows();
    data.phi.Resize(nsol,nstate);
    data.dphix.Resize(nstate*dim,nsol);
    for (int64_t isol =0; isol<nsol; isol++) {
        for (int istate=0; istate<nstate; istate++) {
            data.phi(isol,istate) = data.sol[isol][istate];
            for (int id=0; id<dim; id++) {
                data.dphix(id+istate*dim,isol) = data.dsol[isol](id,istate);
            }
        }
    }
}